

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint unfilter(uchar *out,uchar *in,uint w,uint h,uint bpp)

{
  long lVar1;
  uchar uVar2;
  uchar uVar3;
  ulong uVar4;
  ulong uVar5;
  uchar *puVar6;
  uchar *puVar7;
  uchar *puVar8;
  uchar *puVar9;
  uchar *puVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  
  uVar13 = (ulong)(bpp + 7 >> 3);
  uVar11 = (ulong)(w * bpp + 7 >> 3);
  lVar1 = uVar11 + 1;
  puVar9 = in + 1;
  puVar7 = out + uVar13;
  puVar8 = in + uVar13 + 1;
  puVar6 = (uchar *)0x0;
  puVar10 = out;
  for (uVar5 = 0; uVar5 != h; uVar5 = uVar5 + 1) {
    switch(in[lVar1 * uVar5]) {
    case '\0':
      for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
        puVar10[uVar4] = puVar9[uVar4];
      }
      break;
    case '\x01':
      for (uVar4 = 0; uVar13 != uVar4; uVar4 = uVar4 + 1) {
        puVar10[uVar4] = puVar9[uVar4];
      }
      for (lVar12 = 0; uVar13 + lVar12 < uVar11; lVar12 = lVar12 + 1) {
        puVar7[lVar12] = puVar10[lVar12] + puVar8[lVar12];
      }
      break;
    case '\x02':
      uVar4 = 0;
      if (puVar6 == (uchar *)0x0) {
        for (; uVar11 != uVar4; uVar4 = uVar4 + 1) {
          puVar10[uVar4] = puVar9[uVar4];
        }
      }
      else {
        for (; uVar11 != uVar4; uVar4 = uVar4 + 1) {
          puVar10[uVar4] = puVar6[uVar4] + puVar9[uVar4];
        }
      }
      break;
    case '\x03':
      uVar4 = 0;
      if (puVar6 == (uchar *)0x0) {
        for (; uVar13 != uVar4; uVar4 = uVar4 + 1) {
          puVar10[uVar4] = puVar9[uVar4];
        }
        for (lVar12 = 0; uVar13 + lVar12 < uVar11; lVar12 = lVar12 + 1) {
          puVar7[lVar12] = (puVar10[lVar12] >> 1) + puVar8[lVar12];
        }
      }
      else {
        for (; uVar13 != uVar4; uVar4 = uVar4 + 1) {
          puVar10[uVar4] = (puVar6[uVar4] >> 1) + puVar9[uVar4];
        }
        for (lVar12 = 0; uVar13 + lVar12 < uVar11; lVar12 = lVar12 + 1) {
          puVar7[lVar12] =
               (char)((uint)puVar6[lVar12 + uVar13] + (uint)puVar10[lVar12] >> 1) + puVar8[lVar12];
        }
      }
      break;
    case '\x04':
      uVar4 = 0;
      if (puVar6 == (uchar *)0x0) {
        for (; uVar13 != uVar4; uVar4 = uVar4 + 1) {
          puVar10[uVar4] = puVar9[uVar4];
        }
        for (lVar12 = 0; uVar13 + lVar12 < uVar11; lVar12 = lVar12 + 1) {
          puVar7[lVar12] = puVar10[lVar12] + puVar8[lVar12];
        }
      }
      else {
        for (; uVar13 != uVar4; uVar4 = uVar4 + 1) {
          puVar10[uVar4] = puVar6[uVar4] + puVar9[uVar4];
        }
        for (lVar12 = 0; uVar13 + lVar12 < uVar11; lVar12 = lVar12 + 1) {
          uVar2 = puVar8[lVar12];
          uVar3 = paethPredictor((ushort)puVar10[lVar12],(ushort)puVar6[lVar12 + uVar13],
                                 (ushort)puVar6[lVar12]);
          puVar7[lVar12] = uVar3 + uVar2;
        }
      }
      break;
    default:
      return 0x24;
    }
    puVar6 = out + uVar5 * uVar11;
    puVar10 = puVar10 + uVar11;
    puVar9 = puVar9 + lVar1;
    puVar7 = puVar7 + uVar11;
    puVar8 = puVar8 + lVar1;
  }
  return 0;
}

Assistant:

static unsigned unfilter(unsigned char* out, const unsigned char* in, unsigned w, unsigned h, unsigned bpp)
{
	/*
	For PNG filter method 0
	this function unfilters a single image (e.g. without interlacing this is called once, with Adam7 seven times)
	out must have enough bytes allocated already, in must have the scanlines + 1 filtertype byte per scanline
	w and h are image dimensions or dimensions of reduced image, bpp is bits per pixel
	in and out are allowed to be the same memory address (but aren't the same size since in has the extra filter bytes)
	*/

	unsigned y;
	unsigned char* prevline = 0;

	/*bytewidth is used for filtering, is 1 when bpp < 8, number of bytes per pixel otherwise*/
	size_t bytewidth = (bpp + 7) / 8;
	size_t linebytes = (w * bpp + 7) / 8;

	for (y = 0; y < h; ++y)
	{
		size_t outindex = linebytes * y;
		size_t inindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
		unsigned char filterType = in[inindex];

		CERROR_TRY_RETURN(unfilterScanline(&out[outindex], &in[inindex + 1], prevline, bytewidth, filterType, linebytes));

		prevline = &out[outindex];
	}

	return 0;
}